

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_vprtybd(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->altivec_enabled != false) {
    s = ctx->uc->tcg_ctx;
    uVar1 = ctx->opcode;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 7 & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 0x11 & 0x1f0) + 0x12d20);
    local_48 = ts_00;
    local_40 = ts;
    tcg_gen_callN_ppc64(s,helper_vprtybd_ppc64,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vsplt(DisasContext *ctx, int vece)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int uimm, dofs, bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    uimm = UIMM5(ctx->opcode);
    bofs = avr_full_offset(rB(ctx->opcode));
    dofs = avr_full_offset(rD(ctx->opcode));

    /* Experimental testing shows that hardware masks the immediate.  */
    bofs += (uimm << vece) & 15;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 15;
    bofs &= ~((1 << vece) - 1);
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, vece, dofs, bofs, 16, 16);
}